

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall node::anon_unknown_2::NodeImpl::baseInitialize(NodeImpl *this)

{
  long lVar1;
  bool bVar2;
  ArgsManager *args;
  NodeContext *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  NodeContext *this_00;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  NodeContext **in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  NodeImpl::args((NodeImpl *)in_RDI);
  (**(_func_int **)
     ((in_RDI->kernel)._M_t.
      super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>._M_t.
      super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>.
      super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl + 0x1e8))();
  inline_assertion_check<true,node::NodeContext*>
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
             (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),(char *)this_00);
  bVar2 = AppInitBasicSetup((ArgsManager *)
                            CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                            (atomic<int> *)this_00);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    args = NodeImpl::args((NodeImpl *)this_00);
    bVar2 = AppInitParameterInteraction(args);
    if (bVar2) {
      std::make_unique<node::Warnings>();
      std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator=
                ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)in_RDI,
                 (unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
                ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)in_RDI);
      std::make_unique<kernel::Context>();
      std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::operator=
                (&in_RDI->kernel,
                 (unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::~unique_ptr
                (&in_RDI->kernel);
      std::make_unique<ECC_Context>();
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::operator=
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)in_RDI,
                 (unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)
                 CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)in_RDI);
      std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::operator*
                (&in_RDI->kernel);
      bVar2 = AppInitSanityChecks((Context *)
                                  CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (bVar2) {
        bVar2 = AppInitLockDataDirectory();
        if (bVar2) {
          bVar2 = AppInitInterfaces(in_RDI);
          if (bVar2) {
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
      }
    }
    else {
      bVar2 = false;
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool baseInitialize() override
    {
        if (!AppInitBasicSetup(args(), Assert(context())->exit_status)) return false;
        if (!AppInitParameterInteraction(args())) return false;

        m_context->warnings = std::make_unique<node::Warnings>();
        m_context->kernel = std::make_unique<kernel::Context>();
        m_context->ecc_context = std::make_unique<ECC_Context>();
        if (!AppInitSanityChecks(*m_context->kernel)) return false;

        if (!AppInitLockDataDirectory()) return false;
        if (!AppInitInterfaces(*m_context)) return false;

        return true;
    }